

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O3

void __thiscall
Centaurus::ChaserEM64T<unsigned_char>::~ChaserEM64T(ChaserEM64T<unsigned_char> *this)

{
  pointer pp_Var1;
  
  (this->super_IChaser)._vptr_IChaser = (_func_int **)&PTR__ChaserEM64T_001c5970;
  pp_Var1 = (this->m_funcarray).
            super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pp_Var1 != (pointer)0x0) {
    operator_delete(pp_Var1);
  }
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_funcmap)._M_h);
  ::asmjit::CodeHolder::~CodeHolder(&this->m_code);
  ::asmjit::JitRuntime::~JitRuntime(&this->m_runtime);
  return;
}

Assistant:

virtual ~ChaserEM64T() {}